

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O2

Vector3f __thiscall cosineWeightedHemisphere::sample(cosineWeightedHemisphere *this,Ray *ray,Hit *h)

{
  int iVar1;
  unsigned_long __res;
  long in_RCX;
  result_type_conflict rVar2;
  float f;
  double dVar3;
  float fVar4;
  Vector3f VVar5;
  default_random_engine generator;
  Vector3f y;
  Vector3f x;
  Vector3f normal;
  param_type local_98;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_90;
  Vector3f local_88;
  Vector3f local_7c;
  Vector3f local_70;
  Vector3f local_64;
  Vector3f local_58;
  Vector3f local_4c [2];
  Vector3f local_34;
  
  iVar1 = rand();
  local_90._M_x = (ulong)(long)iVar1 % 0x7fffffff + (ulong)((ulong)(long)iVar1 % 0x7fffffff == 0);
  local_98._M_a = 0.0;
  local_98._M_b = 1.0;
  rVar2 = std::uniform_real_distribution<float>::operator()
                    ((uniform_real_distribution<float> *)&local_98,&local_90);
  if (rVar2 < 0.0) {
    f = sqrtf(rVar2);
  }
  else {
    f = SQRT(rVar2);
  }
  rVar2 = std::uniform_real_distribution<float>::operator()
                    ((uniform_real_distribution<float> *)&local_98,&local_90);
  Vector3f::Vector3f(&local_64,(Vector3f *)(in_RCX + 0x10));
  Vector3f::Vector3f(&local_88,1.0,2.0,3.0);
  Vector3f::cross(&local_88,&local_64);
  Vector3f::normalized(&local_7c);
  Vector3f::cross(&local_70,&local_64);
  Vector3f::normalized(&local_88);
  fVar4 = 1.0 - f * f;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  ::operator*(f,&local_88);
  dVar3 = sin((double)(rVar2 * 6.2831855));
  ::operator*((float)dVar3,local_4c);
  dVar3 = cos((double)(rVar2 * 6.2831855));
  ::operator*((float)dVar3,&local_58);
  operator+(local_4c,&local_58);
  ::operator*(fVar4,&local_34);
  VVar5 = operator+(&local_88,&local_34);
  return (Vector3f)VVar5.m_elements;
}

Assistant:

Vector3f cosineWeightedHemisphere::sample(const Ray &ray, Hit &h) const {
    std::default_random_engine generator(rand());
    std::uniform_real_distribution<float> uniform(0.f, 1.f);

    float r = sqrt(uniform(generator));
    float v = 2.f * (float)M_PI * uniform(generator);
    Vector3f normal = h.getNormal();

    // TODO: think of a better way to do this
    Vector3f x = Vector3f::cross(Vector3f(1., 2., 3.), normal).normalized();
    Vector3f y = Vector3f::cross(x, normal).normalized();

    float factor = sqrt(1-r*r);

    return r * normal + factor * (sin(v) * x + cos(v) * y);
}